

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O2

int Scl_CommandReadLib(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FILE *pFVar5;
  SC_Lib *pLib;
  char *pcVar6;
  void **ppScl;
  uint uVar7;
  char *pcVar8;
  uint fVeryVerbose;
  float fVar9;
  double dVar10;
  float local_4c;
  float local_48;
  uint local_44;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  uVar7 = 1;
  local_4c = 0.0;
  local_48 = 0.0;
  local_44 = 0;
  bVar1 = false;
  fVeryVerbose = 0;
LAB_003a62a3:
  do {
    while( true ) {
      while (iVar3 = Extra_UtilGetopt(argc,argv,"SGMdnvwh"), iVar4 = globalUtilOptind, iVar3 == 0x77
            ) {
        fVeryVerbose = fVeryVerbose ^ 1;
      }
      if (iVar3 == -1) {
        if (globalUtilOptind + 1 == argc) {
          pcVar6 = argv[globalUtilOptind];
          pFVar5 = fopen(pcVar6,"rb");
          if (pFVar5 == (FILE *)0x0) {
            pFVar5 = (FILE *)pAbc->Err;
            pcVar8 = "Cannot open input file \"%s\". \n";
          }
          else {
            fclose(pFVar5);
            pLib = Abc_SclReadLiberty(pcVar6,uVar7,fVeryVerbose);
            if (pLib != (SC_Lib *)0x0) {
              iVar4 = Abc_SclLibClassNum(pLib);
              if (iVar4 < 3) {
                pFVar5 = (FILE *)pAbc->Err;
                uVar7 = Abc_SclLibClassNum(pLib);
                fprintf(pFVar5,"Library with only %d cell classes cannot be used.\n",(ulong)uVar7);
                Abc_SclLibFree(pLib);
                return 0;
              }
              ppScl = &pAbc->pLibScl;
              Abc_SclLoad(pLib,(SC_Lib **)ppScl);
              if (bVar1) {
                Abc_SclShortNames(pLib);
              }
              if (bVar2) {
                if (*ppScl == (void *)0x0) {
                  return 0;
                }
                pcVar6 = Extra_FileNameGenericAppend(pcVar6,"_temp.lib");
                Abc_SclWriteLiberty(pcVar6,(SC_Lib *)*ppScl);
              }
              if (*ppScl == (void *)0x0) {
                return 0;
              }
              Abc_SclInstallGenlib(*ppScl,local_4c,local_48,local_44);
              Mio_LibraryTransferCellIds();
              return 0;
            }
            pFVar5 = (FILE *)pAbc->Err;
            pcVar8 = "Reading SCL library from file \"%s\" has failed. \n";
          }
          fprintf(pFVar5,pcVar8,pcVar6);
          return 1;
        }
        goto LAB_003a652a;
      }
      if (iVar3 != 0x47) break;
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-G\" should be followed by a floating point number.\n";
LAB_003a6520:
        Abc_Print(-1,pcVar6);
        goto LAB_003a652a;
      }
      dVar10 = atof(argv[globalUtilOptind]);
      fVar9 = (float)dVar10;
      local_48 = fVar9;
LAB_003a63b1:
      globalUtilOptind = iVar4 + 1;
      if (fVar9 <= 0.0) goto LAB_003a652a;
    }
    if (iVar3 != 0x4d) {
      if (iVar3 == 0x76) {
        uVar7 = uVar7 ^ 1;
      }
      else if (iVar3 == 100) {
        bVar2 = (bool)(bVar2 ^ 1);
      }
      else {
        if (iVar3 != 0x6e) {
          if (iVar3 == 0x53) {
            if (globalUtilOptind < argc) {
              dVar10 = atof(argv[globalUtilOptind]);
              fVar9 = (float)dVar10;
              local_4c = fVar9;
              goto LAB_003a63b1;
            }
            pcVar6 = "Command line switch \"-S\" should be followed by a floating point number.\n";
            goto LAB_003a6520;
          }
          goto LAB_003a652a;
        }
        bVar1 = (bool)(bVar1 ^ 1);
      }
      goto LAB_003a62a3;
    }
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-M\" should be followed by a positive integer.\n";
      goto LAB_003a6520;
    }
    local_44 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if ((int)local_44 < 0) {
LAB_003a652a:
      fwrite("usage: read_lib [-SG float] [-M num] [-dnvwh] <file>\n",0x35,1,(FILE *)pAbc->Err);
      fwrite("\t           reads Liberty library from file\n",0x2c,1,(FILE *)pAbc->Err);
      fprintf((FILE *)pAbc->Err,
              "\t-S float : the slew parameter used to generate the library [default = %.2f]\n",
              (double)local_4c);
      fprintf((FILE *)pAbc->Err,
              "\t-G float : the gain parameter used to generate the library [default = %.2f]\n",
              (double)local_48);
      fprintf((FILE *)pAbc->Err,
              "\t-M num   : skip gate classes whose size is less than this [default = %d]\n",
              (ulong)local_44);
      pcVar8 = "yes";
      pcVar6 = "yes";
      if (!bVar2) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-d       : toggle dumping the parsed library into file \"*_temp.lib\" [default = %s]\n"
              ,pcVar6);
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-n       : toggle replacing gate/pin names by short strings [default = %s]\n",
              pcVar6);
      pcVar6 = "yes";
      if (uVar7 == 0) {
        pcVar6 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-v       : toggle writing verbose information [default = %s]\n",
              pcVar6);
      if (fVeryVerbose == 0) {
        pcVar8 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-w       : toggle writing information about skipped gates [default = %s]\n",pcVar8)
      ;
      fwrite("\t-h       : prints the command summary\n",0x27,1,(FILE *)pAbc->Err);
      fwrite("\t<file>   : the name of a file to read\n",0x27,1,(FILE *)pAbc->Err);
      return 1;
    }
  } while( true );
}

Assistant:

int Scl_CommandReadLib( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileName;
    FILE * pFile;
    SC_Lib * pLib;
    int c, fDump = 0;
    float Slew = 0;
    float Gain = 0;
    int nGatesMin = 0;
    int fShortNames = 0;
    int fVerbose = 1;
    int fVeryVerbose = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SGMdnvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Slew = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Slew <= 0.0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Gain = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Gain <= 0.0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nGatesMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nGatesMin < 0 ) 
                goto usage;
            break;
        case 'd':
            fDump ^= 1;
            break;
        case 'n':
            fShortNames ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "rb" )) == NULL )
    {
        fprintf( pAbc->Err, "Cannot open input file \"%s\". \n", pFileName );
        return 1;
    }
    fclose( pFile );
    // read new library
    pLib = Abc_SclReadLiberty( pFileName, fVerbose, fVeryVerbose );
    if ( pLib == NULL )
    {
        fprintf( pAbc->Err, "Reading SCL library from file \"%s\" has failed. \n", pFileName );
        return 1;
    }
    if ( Abc_SclLibClassNum(pLib) < 3 )
    {
        fprintf( pAbc->Err, "Library with only %d cell classes cannot be used.\n", Abc_SclLibClassNum(pLib) );
        Abc_SclLibFree(pLib);
        return 0;
    }
    Abc_SclLoad( pLib, (SC_Lib **)&pAbc->pLibScl );
    // convert the library if needed
    if ( fShortNames )
        Abc_SclShortNames( pLib );
    // dump the resulting library
    if ( fDump && pAbc->pLibScl )
        Abc_SclWriteLiberty( Extra_FileNameGenericAppend(pFileName, "_temp.lib"), (SC_Lib *)pAbc->pLibScl );
    // extract genlib library
    if ( pAbc->pLibScl )
    {
        Abc_SclInstallGenlib( pAbc->pLibScl, Slew, Gain, nGatesMin );
        Mio_LibraryTransferCellIds();
    }
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_lib [-SG float] [-M num] [-dnvwh] <file>\n" );
    fprintf( pAbc->Err, "\t           reads Liberty library from file\n" );
    fprintf( pAbc->Err, "\t-S float : the slew parameter used to generate the library [default = %.2f]\n", Slew );
    fprintf( pAbc->Err, "\t-G float : the gain parameter used to generate the library [default = %.2f]\n", Gain );
    fprintf( pAbc->Err, "\t-M num   : skip gate classes whose size is less than this [default = %d]\n", nGatesMin );
    fprintf( pAbc->Err, "\t-d       : toggle dumping the parsed library into file \"*_temp.lib\" [default = %s]\n", fDump? "yes": "no" );
    fprintf( pAbc->Err, "\t-n       : toggle replacing gate/pin names by short strings [default = %s]\n", fShortNames? "yes": "no" );
    fprintf( pAbc->Err, "\t-v       : toggle writing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-w       : toggle writing information about skipped gates [default = %s]\n", fVeryVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : prints the command summary\n" );
    fprintf( pAbc->Err, "\t<file>   : the name of a file to read\n" );
    return 1;
}